

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O3

bool ZXing::OneD::IsCharacterPair(PatternView *v)

{
  Iterator puVar1;
  ulong uVar2;
  bool bVar3;
  ushort uVar4;
  long lVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar10;
  short sVar11;
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  
  puVar1 = v->_data;
  lVar5 = 0x10;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(short *)((long)puVar1 + lVar5);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0x1a);
  sVar10 = puVar1[6] + puVar1[2];
  sVar11 = puVar1[7] + puVar1[3];
  sVar6 = sVar11 + puVar1[5] + puVar1[1];
  sVar7 = sVar11 + puVar1[5] * 2;
  sVar8 = sVar11 + puVar1[7] * 2;
  auVar9._0_2_ = sVar6 + sVar10 + puVar1[4] + *puVar1;
  auVar9._2_2_ = sVar6;
  auVar9._4_2_ = 0;
  auVar9._6_2_ = sVar11 * 2;
  auVar9._8_2_ = sVar7 + sVar10 + puVar1[4] * 2;
  auVar9._10_2_ = sVar7;
  auVar9._12_2_ = sVar8 + sVar10 + puVar1[6] * 2;
  auVar9._14_2_ = sVar8;
  auVar9 = auVar9 & _DAT_00196990;
  uVar2 = auVar9._0_8_ & 0xffff0000ffffffff;
  auVar12._0_4_ = (float)(int)uVar2;
  auVar12._4_4_ = (float)(int)((uint)(uVar2 >> 0x20) | (uint)uVar4);
  auVar12._8_4_ = (float)auVar9._8_4_;
  auVar12._12_4_ = (float)auVar9._12_4_;
  auVar9 = divps(auVar12,_DAT_00196c20);
  if (ABS(auVar9._0_4_ / auVar9._4_4_ + -1.0) < 0.1) {
    bVar3 = true;
    if (v->_size != 0xf) {
      bVar3 = ABS(((float)(ushort)(puVar1[0x14] + puVar1[0x10] + puVar1[0x12] + puVar1[0xe] +
                                  puVar1[0x13] + puVar1[0xf] + puVar1[0x11] + puVar1[0xd]) / 17.0) /
                  auVar9._4_4_ + -1.0) < 0.1;
    }
    return bVar3;
  }
  return false;
}

Assistant:

Iterator begin() const { return _data; }